

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

vec<3,_float,_(glm::qualifier)0> __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::
getData_helper<glm::vec<3,float,(glm::qualifier)0>>(GLAttributeBuffer *this,size_t ind)

{
  bool bVar1;
  int iVar2;
  int64_t iVar3;
  string *in_RCX;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  int __fd;
  string *in_RSI;
  AttributeBuffer *in_RDI;
  vec<3,_float,_(glm::qualifier)0> readValue;
  allocator local_41;
  string local_40 [32];
  string *message;
  string *psVar4;
  
  message = in_RSI;
  bVar1 = AttributeBuffer::isSet(in_RDI);
  __fd = (int)in_RSI;
  if (bVar1) {
    psVar4 = message;
    iVar3 = AttributeBuffer::getDataSize(in_RDI);
    iVar2 = AttributeBuffer::getArrayCount(in_RDI);
    __addr = (sockaddr *)(long)iVar2;
    in_RCX = (string *)(iVar3 * (long)__addr);
    bVar1 = message < in_RCX;
    message = psVar4;
    if (bVar1) goto LAB_00523bec;
  }
  std::allocator<char>::allocator();
  __fd = 0x81241b;
  std::__cxx11::string::string(local_40,"bad getData",&local_41);
  exception(message);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  __addr = extraout_RDX;
LAB_00523bec:
  bind((GLAttributeBuffer *)in_RDI,__fd,__addr,(socklen_t)in_RCX);
  return (vec<3,_float,_(glm::qualifier)0>)ZEXT812(0);
}

Assistant:

T GLAttributeBuffer::getData_helper(size_t ind) {
  if (!isSet() || ind >= static_cast<size_t>(getDataSize() * getArrayCount())) exception("bad getData");
  bind();
  T readValue{};
  return readValue;
}